

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O1

char * ODDLParser::OpenDDLParser::parseHexaLiteral(char *in,char *end,Value **data)

{
  byte bVar1;
  bool bVar2;
  long lVar3;
  byte *pbVar4;
  Value *this;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  byte *pbVar10;
  ulong value;
  
  *data = (Value *)0x0;
  pbVar10 = (byte *)in;
  if (in != end && in != (char *)0x0) {
    do {
      pbVar10 = (byte *)in;
      if ((0x2c < (ulong)(byte)*in) || ((0x100100002600U >> ((ulong)(byte)*in & 0x3f) & 1) == 0))
      break;
      in = (char *)((byte *)in + 1);
      pbVar10 = (byte *)end;
    } while (in != end);
    if (*pbVar10 == 0x30) {
      if ((pbVar10[1] | 0x20) == 0x78) {
        pbVar4 = pbVar10 + 2;
        if (pbVar4 == (byte *)end) {
          iVar5 = 0;
          end = (char *)pbVar4;
        }
        else {
          iVar5 = ((int)end - (int)pbVar10) + -2;
          lVar9 = 0;
          do {
            bVar1 = pbVar4[lVar9];
            if ((((ulong)bVar1 < 0x2d) && ((0x130100000200U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) ||
               ((bVar1 - 0x5b < 0x23 && ((0x500000001U >> ((ulong)(bVar1 - 0x5b) & 0x3f) & 1) != 0))
               )) {
              iVar5 = (int)lVar9;
              end = (char *)(pbVar4 + lVar9);
              break;
            }
            lVar3 = lVar9 + 1;
            lVar9 = lVar9 + 1;
          } while (pbVar4 + lVar3 != (byte *)end);
        }
        value = 0;
        if (0 < iVar5) {
          do {
            iVar6 = (int)(char)*pbVar4;
            if ((byte)(*pbVar4 - 0x30) < 10) {
              uVar7 = iVar6 - 0x30;
            }
            else {
              uVar8 = iVar6 - 0x61U;
              if (iVar6 - 0x41U < iVar6 - 0x61U) {
                uVar8 = iVar6 - 0x41U;
              }
              uVar7 = 0xf;
              if (uVar8 < 0xf) {
                uVar7 = uVar8;
              }
              do {
                if (uVar8 == uVar7) {
                  uVar7 = uVar7 + 10;
                  goto LAB_0068d242;
                }
              } while (uVar8 < 0xf);
              uVar7 = 9999999;
            }
LAB_0068d242:
            uVar7 = (int)value << 4 | uVar7;
            value = (ulong)uVar7;
            pbVar4 = pbVar4 + 1;
            bVar2 = 1 < iVar5;
            iVar5 = iVar5 + -1;
          } while (bVar2);
          value = (ulong)(int)uVar7;
        }
        this = ValueAllocator::allocPrimData(ddl_unsigned_int64,1);
        *data = this;
        pbVar10 = (byte *)end;
        if (this != (Value *)0x0) {
          Value::setUnsignedInt64(this,value);
        }
      }
      else {
        pbVar10 = pbVar10 + 1;
      }
    }
  }
  return (char *)pbVar10;
}

Assistant:

char *OpenDDLParser::parseHexaLiteral( char *in, char *end, Value **data ) {
    *data = ddl_nullptr;
    if( ddl_nullptr == in || in == end ) {
        return in;
    }

    in = lookForNextToken( in, end );
    if( *in != '0' ) {
        return in;
    }

    ++in;
    if( *in != 'x' && *in != 'X' ) {
        return in;
    }

    ++in;
    bool ok( true );
    char *start( in );
    int pos( 0 );
    while( !isSeparator( *in ) && in != end ) {
        if( ( *in < '0' && *in > '9' ) || ( *in < 'a' && *in > 'f' ) || ( *in < 'A' && *in > 'F' ) ) {
            ok = false;
            break;
        }
        ++pos;
        ++in;
    }

    if( !ok ) {
        return in;
    }

    int value( 0 );
    while( pos > 0 ) {
        int v = hex2Decimal( *start );
        --pos;
        value = ( value << 4 ) | v;
        ++start;
    }

    *data = ValueAllocator::allocPrimData( Value::ddl_unsigned_int64 );
    if( ddl_nullptr != *data ) {
        ( *data )->setUnsignedInt64( value );
    }

    return in;
}